

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  uint in_EDI;
  ImGuiID unaff_retaddr;
  ImGuiKey unaff_retaddr_00;
  
  if ((in_EDI & 0x1000) != 0) {
    SetKeyOwner(unaff_retaddr_00,unaff_retaddr,in_EDI);
  }
  if ((in_EDI & 0x2000) != 0) {
    SetKeyOwner(unaff_retaddr_00,unaff_retaddr,in_EDI);
  }
  if ((in_EDI & 0x4000) != 0) {
    SetKeyOwner(unaff_retaddr_00,unaff_retaddr,in_EDI);
  }
  if ((in_EDI & 0x8000) != 0) {
    SetKeyOwner(unaff_retaddr_00,unaff_retaddr,in_EDI);
  }
  if ((in_EDI & 0xffff0fff) != 0) {
    SetKeyOwner(unaff_retaddr_00,unaff_retaddr,in_EDI);
  }
  return;
}

Assistant:

void ImGui::SetKeyOwnersForKeyChord(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    if (key_chord & ImGuiMod_Ctrl)      { SetKeyOwner(ImGuiMod_Ctrl, owner_id, flags); }
    if (key_chord & ImGuiMod_Shift)     { SetKeyOwner(ImGuiMod_Shift, owner_id, flags); }
    if (key_chord & ImGuiMod_Alt)       { SetKeyOwner(ImGuiMod_Alt, owner_id, flags); }
    if (key_chord & ImGuiMod_Super)     { SetKeyOwner(ImGuiMod_Super, owner_id, flags); }
    if (key_chord & ~ImGuiMod_Mask_)    { SetKeyOwner((ImGuiKey)(key_chord & ~ImGuiMod_Mask_), owner_id, flags); }
}